

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::EndTestCase
          (XmlReporter *this,TestCaseInfo *param_1,Totals *param_2,string *param_3,string *param_4)

{
  allocator<char> local_62;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"OverallResult",&local_61);
  XmlWriter::scopedElement((XmlWriter *)local_60,(string *)&this->m_xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_60 + 8),"success",&local_62);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)local_60,(string *)(local_60 + 8),&this->m_currentTestSuccess);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
  std::__cxx11::string::~string(local_38);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string&, const std::string& ) {
            m_xml.scopedElement( "OverallResult" ).writeAttribute( "success", m_currentTestSuccess );
            m_xml.endElement();
        }